

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

MeshAttributeIndicesEncodingData * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::GetAttributeEncodingData
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,int att_id)

{
  pointer pAVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  pAVar1 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->attribute_data_).
                super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar4 != 0) {
    uVar2 = (lVar4 >> 4) * -0x79435e50d79435e5;
    uVar3 = 1;
    uVar5 = 0;
    do {
      if (pAVar1[uVar5].attribute_index == att_id) {
        return &pAVar1[uVar5].encoding_data;
      }
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  return &this->pos_encoding_data_;
}

Assistant:

const MeshAttributeIndicesEncodingData *
MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetAttributeEncodingData(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      return &attribute_data_[i].encoding_data;
    }
  }
  return &pos_encoding_data_;
}